

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::RegexEs5TestImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input)

{
  RegexPattern *this;
  code *pcVar1;
  undefined4 uVar2;
  undefined8 this_00;
  ScriptContext *pSVar3;
  ScriptContext *regularExpression_00;
  uint uVar4;
  JavascriptString *input_00;
  bool bVar5;
  bool bVar6;
  BOOLEAN BVar7;
  undefined4 *puVar8;
  Recycler *pRVar9;
  RecyclerWeakReferenceBase *pRVar10;
  JavascriptBoolean *pJVar11;
  ulong uVar12;
  Type TVar13;
  undefined8 uVar14;
  GroupInfo GVar15;
  GroupInfo in_R8;
  uint uVar16;
  JavascriptString *cachedValue;
  ulong uVar17;
  uint offset;
  char *pcVar18;
  byte bVar19;
  undefined1 local_98 [32];
  Type local_78;
  ulong local_60;
  ScriptContext *local_58;
  ScriptContext *local_50;
  uint local_44;
  JavascriptString *local_40;
  bool local_32;
  bool local_31;
  
  this = (regularExpression->pattern).ptr;
  local_50 = (ScriptContext *)regularExpression;
  local_98._16_8_ = JavascriptString::GetString(input);
  local_78._0_4_ = JavascriptString::GetLength(input);
  bVar5 = UnifiedRegex::RegexPattern::IsGlobal(this);
  local_32 = UnifiedRegex::RegexPattern::IsSticky(this);
  local_60 = CONCAT71(local_60._1_7_,bVar5);
  local_31 = bVar5 || local_32;
  local_98._8_8_ = this;
  local_40 = input;
  if (bVar5 || local_32) {
    TVar13.ptr = (Matcher *)0x0;
    local_44 = 0;
    cachedValue = (JavascriptString *)0x0;
    local_78.unified.trigramInfo.ptr = (Type)(TrigramInfo *)0x0;
  }
  else {
    UnifiedRegex::RegexPattern::EnsureTestCache((RegexPattern *)local_98);
    local_44 = UnifiedRegex::RegexPattern::GetTestCacheIndex(input);
    local_78.unified.trigramInfo.ptr = (Type)(Type)local_98._0_8_;
    if (*(_func_int **)(local_98._0_8_ + ((ulong)local_44 + 1) * 8) == (_func_int *)0x0) {
      cachedValue = (JavascriptString *)0x0;
    }
    else {
      cachedValue = *(JavascriptString **)
                     *(_func_int **)(local_98._0_8_ + ((ulong)local_44 + 1) * 8);
    }
    TVar13.ptr = (Matcher *)CONCAT71(SUB87(local_98._0_8_,1),cachedValue == local_40);
  }
  input_00 = local_40;
  local_58 = scriptContext;
  RegexHelperTrace(scriptContext,Test,(JavascriptRegExp *)local_50,local_40);
  bVar5 = local_31;
  uVar14 = (ulong)TVar13.ptr & 0xff;
  local_98._24_8_ = cachedValue;
  local_78.unified.matcher.ptr = (Type)TVar13.ptr;
  UnifiedRegex::RegexPattern::TraceTestCache(SUB81(TVar13.ptr,0),input_00,cachedValue,local_31);
  uVar4 = local_44;
  offset = 0;
  uVar16 = 0;
  if (SUB81(TVar13.ptr,0) != false) {
    if (bVar5 != false) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                  ,0x2c2,"(useCache)","useCache");
      if (!bVar6) goto LAB_00d4c178;
      *puVar8 = 0;
    }
    uVar14 = local_78.unified.trigramInfo.ptr;
    BVar7 = BVStatic<8UL>::Test((BVStatic<8UL> *)local_78.unified.trigramInfo.ptr,uVar4);
    uVar16 = (uint)(BVar7 != '\0');
    if (BVar7 != '\0') {
      uVar14 = (((local_58->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
               ).regexConstructor.ptr;
      JavascriptRegExpConstructor::InvalidateLastMatch
                ((JavascriptRegExpConstructor *)uVar14,
                 (RegexPattern *)(local_50->super_ScriptContextBase).pActiveScriptDirect,local_40);
      uVar16 = 1;
    }
  }
  pSVar3 = local_50;
  bVar6 = true;
  if (bVar5 != false) {
    if (*(int *)&((Type *)&local_50->prev)->ptr == -2) {
      uVar14 = local_50;
      JavascriptRegExp::CacheLastIndex((JavascriptRegExp *)local_50);
    }
    offset = *(uint *)&((Type *)&pSVar3->prev)->ptr;
    if (0x7ffffffe < offset) {
      pSVar3->next = (ScriptContext *)0x0;
      *(undefined4 *)&((Type *)&pSVar3->prev)->ptr = 0;
      bVar6 = false;
    }
  }
  pSVar3 = local_58;
  this_00 = local_78.unified.trigramInfo.ptr;
  if (bVar6) {
    local_78._4_4_ = uVar16;
    if ((uint)local_78._0_4_ < offset) {
      uVar17 = 0xffffffff;
      uVar12 = 0;
    }
    else {
      in_R8.length = 0;
      in_R8.offset = offset;
      uVar14 = local_58;
      GVar15 = SimpleMatch(local_58,(RegexPattern *)local_98._8_8_,(char16 *)local_98._16_8_,
                           local_78._0_4_,offset);
      uVar12 = (ulong)GVar15 & 0xffffffff;
      uVar17 = (ulong)GVar15 >> 0x20;
    }
    regularExpression_00 = local_50;
    GVar15 = (GroupInfo)(uVar17 << 0x20 | uVar12);
    PropagateLastMatchToRegex
              ((ScriptContext *)uVar14,local_60._0_1_,local_32,(JavascriptRegExp *)local_50,in_R8,
               GVar15);
    PropagateLastMatchToCtor(pSVar3,(JavascriptRegExp *)regularExpression_00,local_40,GVar15,false);
    pSVar3 = local_50;
    uVar2 = local_78._4_4_;
    bVar19 = (int)uVar17 != -1;
    local_60 = uVar17;
    if (local_31 == false) {
      local_31 = (bool)bVar19;
      if (offset != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2ea,"(offset == 0)","offset == 0");
        if (!bVar5) goto LAB_00d4c178;
        *puVar8 = 0;
      }
      bVar19 = local_78._8_1_ ^ 1;
      if ((JavascriptString *)local_98._24_8_ != local_40 && bVar19 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2eb,"(!cacheHit || cachedInput == input)",
                                    "!cacheHit || cachedInput == input");
        if (!bVar5) goto LAB_00d4c178;
        *puVar8 = 0;
      }
      uVar4 = local_44;
      uVar14 = local_78.unified.trigramInfo.ptr;
      if ((bool)(char)uVar2 == ((int)local_60 == -1) && bVar19 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2ec,"(!cacheHit || cachedResult == wasFound)",
                                    "!cacheHit || cachedResult == wasFound");
        if (!bVar5) {
LAB_00d4c178:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar8 = 0;
      }
      pRVar9 = RecyclableObject::GetRecycler((RecyclableObject *)pSVar3);
      pRVar10 = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                          (&pRVar9->weakReferenceMap,(char *)local_40,pRVar9);
      if (pRVar10->typeInfo == (Type)0x0) {
        pRVar10->typeInfo = (Type)&JavascriptString::typeinfo;
        Memory::Recycler::TrackAllocWeakRef(pRVar9,pRVar10);
      }
      pcVar18 = (char *)((ulong)uVar4 * 8 + 8 + uVar14);
      Memory::Recycler::WBSetBit(pcVar18);
      *(RecyclerWeakReferenceBase **)pcVar18 = pRVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar18);
      if ((int)local_60 == -1) {
        BVStatic<8UL>::Clear((BVStatic<8UL> *)uVar14,uVar4);
        bVar19 = local_31;
      }
      else {
        BVStatic<8UL>::Set((BVStatic<8UL> *)uVar14,uVar4);
        bVar19 = local_31;
      }
    }
    pJVar11 = (JavascriptBoolean *)JavascriptBoolean::ToVar((uint)bVar19,local_58);
  }
  else {
    bVar19 = local_78._8_1_;
    if (bVar5 == false) {
      if (offset != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2d7,"(offset == 0)","offset == 0");
        if (!bVar5) goto LAB_00d4c178;
        *puVar8 = 0;
        bVar19 = local_78._8_1_;
      }
      if (bVar19 == 1 && (JavascriptString *)local_98._24_8_ != local_40) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2d8,"(!cacheHit || cachedInput == input)",
                                    "!cacheHit || cachedInput == input");
        if (!bVar5) goto LAB_00d4c178;
        *puVar8 = 0;
        bVar19 = local_78._8_1_;
      }
      if ((bVar19 & (byte)uVar16) == 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2d9,"(!cacheHit || cachedResult == false)",
                                    "!cacheHit || cachedResult == false");
        if (!bVar5) goto LAB_00d4c178;
        *puVar8 = 0;
      }
      pRVar9 = RecyclableObject::GetRecycler((RecyclableObject *)local_50);
      pRVar10 = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                          (&pRVar9->weakReferenceMap,(char *)local_40,pRVar9);
      if (pRVar10->typeInfo == (Type)0x0) {
        pRVar10->typeInfo = (Type)&JavascriptString::typeinfo;
        Memory::Recycler::TrackAllocWeakRef(pRVar9,pRVar10);
      }
      pcVar18 = (char *)(this_00 + (ulong)uVar4 * 8 + 8);
      Memory::Recycler::WBSetBit(pcVar18);
      *(RecyclerWeakReferenceBase **)pcVar18 = pRVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar18);
      BVStatic<8UL>::Clear((BVStatic<8UL> *)this_00,uVar4);
    }
    pJVar11 = (((local_58->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
              .booleanFalse.ptr;
  }
  return pJVar11;
}

Assistant:

Var RegexHelper::RegexEs5TestImpl(ScriptContext* scriptContext, JavascriptRegExp *regularExpression, JavascriptString *input)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();
        UnifiedRegex::GroupInfo match; // initially undefined

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        const bool useCache = !isGlobal && !isSticky;

        UnifiedRegex::RegExpTestCache* cache = nullptr;
        JavascriptString * cachedInput = nullptr;
        uint cacheIndex = 0;
        bool cacheHit = false;
        bool cachedResult = false;
        if (useCache)
        {
            cache = pattern->EnsureTestCache();
            cacheIndex = UnifiedRegex::RegexPattern::GetTestCacheIndex(input);
            cachedInput = cache->inputArray[cacheIndex] != nullptr ? cache->inputArray[cacheIndex]->Get() : nullptr;
            cacheHit = cachedInput == input;
        }
#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Test, regularExpression, input);
        UnifiedRegex::RegexPattern::TraceTestCache(cacheHit, input, cachedInput, !useCache);
#endif

        if (cacheHit)
        {
            Assert(useCache);
            cachedResult = (cache->resultBV.Test(cacheIndex) != 0);

            // If our cache says this test should produce a match (which we aren't going to compute),
            // notify the Ctor to invalidate the last match so it must be recomputed before access.
            if (cachedResult)
            {
                InvalidateLastMatchOnCtor(scriptContext, regularExpression, input);
            }

            // for debug builds, let's still do the real test so we can validate values in the cache
#if !DBG
            return JavascriptBoolean::ToVar(cachedResult, scriptContext);
#endif
        }

        CharCount offset;
        if (!GetInitialOffset(isGlobal, isSticky, regularExpression, inputLength, offset))
        {
            if (useCache)
            {
                Assert(offset == 0);
                Assert(!cacheHit || cachedInput == input);
                Assert(!cacheHit || cachedResult == false);
                cache->inputArray[cacheIndex] = regularExpression->GetRecycler()->CreateWeakReferenceHandle(input);
                cache->resultBV.Clear(cacheIndex);
            }
            return scriptContext->GetLibrary()->GetFalse();
        }
        if (offset <= inputLength)
        {
            match = SimpleMatch(scriptContext, pattern, inputStr, inputLength, offset);
        }

        // else: match remains undefined
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, match, match, true, true);
        bool wasFound = !match.IsUndefined();

        if (useCache)
        {
            Assert(offset == 0);
            Assert(!cacheHit || cachedInput == input);
            Assert(!cacheHit || cachedResult == wasFound);
            cache->inputArray[cacheIndex] = regularExpression->GetRecycler()->CreateWeakReferenceHandle(input);
            if (wasFound)
            {
                cache->resultBV.Set(cacheIndex);
            }
            else
            {
                cache->resultBV.Clear(cacheIndex);
            }
        }
        return JavascriptBoolean::ToVar(wasFound, scriptContext);
    }